

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplePosRasterizationTest::init
          (SamplePosRasterizationTest *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
  *this_00;
  TestLog *pTVar1;
  _anonymous_namespace_ *this_01;
  pointer pTVar2;
  pointer pVVar3;
  Context *pCVar4;
  RenderContext *renderCtx;
  GLuint *pGVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  undefined4 uVar9;
  GLint GVar10;
  int extraout_EAX;
  undefined4 extraout_var;
  RenderTarget *pRVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ShaderProgram *this_02;
  long *plVar12;
  NotSupportedError *pNVar13;
  TestError *pTVar14;
  char *pcVar15;
  string *description;
  pointer ppSVar16;
  int i;
  long lVar17;
  long lVar18;
  float fVar19;
  GLint maxSamples;
  StateQueryMemoryWriteGuard<float[2]> position;
  GLuint fboID;
  ScopedLogSection section;
  ShaderProgram program;
  int local_34c;
  undefined1 local_348 [8];
  undefined1 auStack_340 [8];
  undefined1 local_338 [24];
  string local_320;
  undefined1 local_300 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  int *local_2d8;
  float local_2cc;
  string local_2c8;
  undefined1 local_2a8 [4];
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  ios_base local_230 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_218;
  undefined1 local_1f8 [208];
  float local_128;
  GLuint *local_118;
  GLuint *local_110;
  GLuint *local_108;
  undefined1 local_100 [16];
  undefined1 local_f0 [136];
  deUint32 local_68;
  bool local_40;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar18 = CONCAT44(extraout_var,iVar7);
  local_34c = 0;
  pRVar11 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_2d8 = &this->m_canvasSize;
  if (this->m_canvasSize <= pRVar11->m_width) {
    pRVar11 = Context::getRenderTarget((this->super_TestCase).m_context);
    if (this->m_canvasSize <= pRVar11->m_height) {
      (**(code **)(lVar18 + 0x868))(0x910e,&local_34c);
      if (local_34c < this->m_samples) {
        pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        _local_2a8 = (pointer)&local_298;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,
                   "Requested sample count is greater than GL_MAX_COLOR_TEXTURE_SAMPLES","");
        tcu::NotSupportedError::NotSupportedError(pNVar13,(string *)local_2a8);
        __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_2a8 = SUB84(pTVar1,0);
      fStack_2a4 = (float)((ulong)pTVar1 >> 0x20);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_2a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_2a0,"GL_MAX_COLOR_TEXTURE_SAMPLES = ",0x1f);
      std::ostream::operator<<((ostringstream *)&fStack_2a0,local_34c);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_2a0);
      std::ios_base::~ios_base(local_230);
      (**(code **)(lVar18 + 0x868))(0xd50,&this->m_subpixelBits);
      pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_2a8 = SUB84(pTVar1,0);
      fStack_2a4 = (float)((ulong)pTVar1 >> 0x20);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_2a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_2a0,"GL_SUBPIXEL_BITS = ",0x13);
      std::ostream::operator<<((ostringstream *)&fStack_2a0,this->m_subpixelBits);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_2a0);
      std::ios_base::~ios_base(local_230);
      pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_2a8 = SUB84(pTVar1,0);
      fStack_2a4 = (float)((ulong)pTVar1 >> 0x20);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_2a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_2a0,"Creating multisample texture",0x1c);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_2a0);
      std::ios_base::~ios_base(local_230);
      local_108 = &this->m_texID;
      iVar7 = 1;
      (**(code **)(lVar18 + 0x6f8))(1);
      (**(code **)(lVar18 + 0xb8))(0x9100,this->m_texID);
      (**(code **)(lVar18 + 0x1390))
                (0x9100,this->m_samples,0x8058,this->m_canvasSize,this->m_canvasSize,1);
      dVar8 = (**(code **)(lVar18 + 0x800))();
      glu::checkError(dVar8,"texStorage2DMultisample",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0xe3);
      local_110 = &this->m_vaoID;
      (**(code **)(lVar18 + 0x708))(1);
      (**(code **)(lVar18 + 0xd8))(this->m_vaoID);
      dVar8 = (**(code **)(lVar18 + 0x800))();
      glu::checkError(dVar8,"bindVertexArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0xe7);
      local_118 = &this->m_vboID;
      (**(code **)(lVar18 + 0x6c8))(1);
      (**(code **)(lVar18 + 0x40))(0x8892,this->m_vboID);
      dVar8 = (**(code **)(lVar18 + 0x800))();
      pcVar15 = (char *)0xeb;
      glu::checkError(dVar8,"bindBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0xeb);
      this_00 = &this->m_testTriangles;
      do {
        local_2a8 = (undefined1  [4])((1.0 / (float)iVar7 + (float)(iVar7 + -1)) / 20.0);
        fStack_2a4 = 0.0;
        fStack_2a0 = 0.0;
        fStack_29c = 1.0;
        local_298._M_allocated_capacity._0_4_ =
             ((float)(iVar7 + -1) + 0.3 + 1.0 / (float)iVar7) / 20.0;
        local_298._M_allocated_capacity._4_4_ = 0.0;
        local_298._8_4_ = 0.0;
        local_298._12_4_ = 1.0;
        fStack_284 = -1.0;
        fStack_280 = 0.0;
        fStack_27c = 1.0;
        local_288 = (float)local_2a8;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
        ::push_back(this_00,(value_type *)local_2a8);
        iVar7 = iVar7 + 1;
      } while (iVar7 != 0x15);
      iVar7 = 1;
      do {
        fStack_2a4 = (1.0 / (float)iVar7 + (float)(iVar7 + -1)) / 20.0;
        local_2a8 = (undefined1  [4])0xbf800000;
        fStack_2a0 = 0.0;
        fStack_29c = 1.0;
        local_298._M_allocated_capacity._4_4_ =
             ((float)(iVar7 + -1) + 0.3 + 1.0 / (float)iVar7) / 20.0;
        local_298._M_allocated_capacity._0_4_ = -1.0;
        local_298._8_4_ = 0.0;
        local_298._12_4_ = 1.0;
        local_288 = 0.0;
        fStack_280 = 0.0;
        fStack_27c = 1.0;
        fStack_284 = fStack_2a4;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
        ::push_back(this_00,(value_type *)local_2a8);
        iVar7 = iVar7 + 1;
      } while (iVar7 != 0x15);
      iVar7 = 0;
      do {
        local_2cc = ((float)iVar7 / 20.0) * 3.1415927;
        local_2cc = local_2cc + local_2cc;
        local_128 = cosf(local_2cc);
        fVar19 = sinf(local_2cc);
        local_2a8 = (undefined1  [4])0x3ecccccd;
        fStack_2a4 = 0.4;
        fStack_2a0 = 0.0;
        fStack_29c = 1.0;
        local_298._M_allocated_capacity._0_4_ = local_128 * 0.5 + 0.5;
        local_298._M_allocated_capacity._4_4_ = fVar19 * 0.5 + 0.5;
        local_298._8_4_ = 0.0;
        local_298._12_4_ = 1.0;
        local_288 = (float)local_298._M_allocated_capacity._0_4_ + 0.1;
        fStack_284 = (float)local_298._M_allocated_capacity._4_4_ + 0.02;
        fStack_280 = 0.0;
        fStack_27c = 1.0;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
        ::push_back(this_00,(value_type *)local_2a8);
        iVar7 = iVar7 + 1;
      } while (iVar7 != 0x14);
      local_2a8 = (undefined1  [4])0xbe4ed917;
      fStack_2a4 = -0.202;
      fStack_2a0 = 0.0;
      fStack_29c = 1.0;
      local_298._M_allocated_capacity._0_4_ = -0.802;
      local_298._M_allocated_capacity._4_4_ = -0.202;
      local_298._8_4_ = 0.0;
      local_298._12_4_ = 1.0;
      local_288 = -0.802;
      fStack_284 = -0.802;
      fStack_280 = 0.0;
      fStack_27c = 1.0;
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
      ::push_back(this_00,(value_type *)local_2a8);
      iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      lVar18 = CONCAT44(extraout_var_00,iVar7);
      this_01 = (_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx;
      memset(local_2a8,0,0xac);
      local_1f8._0_8_ = (pointer)0x0;
      local_1f8[8] = 0;
      local_1f8._9_7_ = 0;
      local_1f8[0x10] = 0;
      local_1f8._17_8_ = 0;
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_320,this_01,
                 (Context *)
                 "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
                 ,pcVar15);
      local_348 = (undefined1  [8])((ulong)(uint)local_348._4_4_ << 0x20);
      auStack_340 = (undefined1  [8])(local_338 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)auStack_340,local_320._M_dataplus._M_p,
                 local_320._M_dataplus._M_p + local_320._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2a8 + ((ulong)local_348 & 0xffffffff) * 0x18),(value_type *)auStack_340)
      ;
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_2c8,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx
                 ,(Context *)
                  "${GLSL_VERSION_DECL}\nlayout(location = 0) out highp vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0, 1.0, 1.0, 1.0);\n}\n"
                 ,pcVar15);
      local_300._0_4_ = 1;
      local_300._8_8_ = local_2f0._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_300 + 8),local_2c8._M_dataplus._M_p,
                 local_2c8._M_dataplus._M_p + local_2c8._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2a8 + (ulong)(uint)local_300._0_4_ * 0x18),(value_type *)(local_300 + 8)
                 );
      glu::ShaderProgram::ShaderProgram
                ((ShaderProgram *)local_100,(RenderContext *)this_01,(ProgramSources *)local_2a8);
      if ((char *)local_300._8_8_ != local_2f0._M_local_buf + 8) {
        operator_delete((void *)local_300._8_8_,local_2f0._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      if (auStack_340 != (undefined1  [8])(local_338 + 8)) {
        operator_delete((void *)auStack_340,local_338._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1f8);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_218);
      lVar17 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2a8 + lVar17));
        lVar17 = lVar17 + -0x18;
      } while (lVar17 != -0x18);
      uVar9 = (**(code **)(lVar18 + 0x780))(local_68,"a_position");
      pGVar5 = local_108;
      local_300._0_4_ = 0;
      if (local_40 == false) {
        glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        (ShaderProgram *)local_100);
        pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
        _local_2a8 = (pointer)&local_298;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,"Failed to build shader.","");
        tcu::TestError::TestError(pTVar14,(string *)local_2a8);
        __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar18 + 0xb8))(0x9100,*local_108);
      (**(code **)(lVar18 + 0xd8))(*local_110);
      (**(code **)(lVar18 + 0x40))(0x8892,*local_118);
      pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_2a8 = SUB84(pTVar1,0);
      fStack_2a4 = (float)((ulong)pTVar1 >> 0x20);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_2a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_2a0,"Attaching texture to FBO",0x18);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_2a0);
      std::ios_base::~ios_base(local_230);
      (**(code **)(lVar18 + 0x6d0))(1,local_300);
      (**(code **)(lVar18 + 0x78))(0x8d40,local_300._0_4_);
      (**(code **)(lVar18 + 0x6a0))(0x8d40,0x8ce0,0x9100,*pGVar5,0);
      dVar8 = (**(code **)(lVar18 + 0x800))();
      glu::checkError(dVar8,"framebufferTexture2D",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0x17a);
      pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_2a8 = SUB84(pTVar1,0);
      fStack_2a4 = (float)((ulong)pTVar1 >> 0x20);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_2a0);
      local_128 = (float)uVar9;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_2a0,"Sample locations:",0x11);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_2a0);
      std::ios_base::~ios_base(local_230);
      if (0 < this->m_samples) {
        iVar7 = 0;
        do {
          local_338._0_4_ = -8.0297587e+18;
          local_338._4_4_ = -8.0297587e+18;
          local_348._0_4_ = -8.0297587e+18;
          local_348._4_4_ = -8.0297587e+18;
          auStack_340 = (undefined1  [8])0xdededededededede;
          (**(code **)(lVar18 + 0x8e8))(0x8e50,iVar7,auStack_340);
          bVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[2]>::verifyValidity
                            ((StateQueryMemoryWriteGuard<float[2]> *)local_348,
                             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          if (!bVar6) {
            pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
            _local_2a8 = (pointer)&local_298;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2a8,"Error while querying sample positions","");
            tcu::TestError::TestError(pTVar14,(string *)local_2a8);
            __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          local_2a8 = SUB84(pTVar1,0);
          fStack_2a4 = (float)((ulong)pTVar1 >> 0x20);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_2a0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_2a0,"\t",1);
          std::ostream::operator<<((ostringstream *)&fStack_2a0,iVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_2a0,": (",3);
          std::ostream::_M_insert<double>((double)(float)auStack_340._0_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_2a0,", ",2);
          std::ostream::_M_insert<double>((double)(float)auStack_340._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_2a0,")",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_2a0);
          std::ios_base::~ios_base(local_230);
          local_2a8 = auStack_340._0_4_;
          fStack_2a4 = auStack_340._4_4_;
          std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
          emplace_back<tcu::Vector<float,2>>
                    ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)
                     &this->m_samplePositions,(Vector<float,_2> *)local_2a8);
          iVar7 = iVar7 + 1;
        } while (iVar7 < this->m_samples);
      }
      pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_2a8 = SUB84(pTVar1,0);
      fStack_2a4 = (float)((ulong)pTVar1 >> 0x20);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_2a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_2a0,"Drawing test pattern to the texture",0x23);
      fVar19 = local_128;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_2a0);
      std::ios_base::~ios_base(local_230);
      pTVar2 = (this->m_testTriangles).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (**(code **)(lVar18 + 0x150))
                (0x8892,(long)(this->m_testTriangles).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2,pTVar2,
                 0x88e4);
      dVar8 = (**(code **)(lVar18 + 0x800))();
      glu::checkError(dVar8,"bufferData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0x192);
      (**(code **)(lVar18 + 0x1a00))(0,0,*local_2d8);
      (**(code **)(lVar18 + 0x1c0))(0,0,0,0x3f800000);
      (**(code **)(lVar18 + 0x188))(0x4000);
      (**(code **)(lVar18 + 0x19f0))(fVar19,4,0x1406,0,0,0);
      (**(code **)(lVar18 + 0x610))(fVar19);
      dVar8 = (**(code **)(lVar18 + 0x800))();
      glu::checkError(dVar8,"vertexAttribPointer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0x199);
      (**(code **)(lVar18 + 0x1680))(local_68);
      (**(code **)(lVar18 + 0x538))
                (4,0,(ulong)((long)(this->m_testTriangles).
                                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_testTriangles).
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4);
      dVar8 = (**(code **)(lVar18 + 0x800))();
      glu::checkError(dVar8,"drawArrays",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0x19d);
      (**(code **)(lVar18 + 0x518))(fVar19);
      (**(code **)(lVar18 + 0x1680))(0);
      (**(code **)(lVar18 + 0x440))(1,local_300);
      dVar8 = (**(code **)(lVar18 + 0x800))();
      glu::checkError(dVar8,"cleanup",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                      ,0x1a2);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_100);
      if (0 < (long)this->m_samples) {
        pVVar3 = (this->m_samplePositions).
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar18 = 0;
        iVar7 = 0;
        do {
          fVar19 = *(float *)((long)pVVar3->m_data + lVar18);
          if ((((fVar19 < 0.0) || (1.0 < fVar19)) ||
              (fVar19 = *(float *)((long)pVVar3->m_data + lVar18 + 4), fVar19 < 0.0)) ||
             (1.0 < fVar19)) {
            pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            local_2a8 = SUB84(pTVar1,0);
            fStack_2a4 = (float)((ulong)pTVar1 >> 0x20);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_2a0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&fStack_2a0,"// ERROR: Sample position of sample ",0x24);
            std::ostream::operator<<((ostringstream *)&fStack_2a0,iVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&fStack_2a0," should be in range ([0, 1], [0, 1]). Got ",0x2a);
            tcu::operator<<((ostream *)&fStack_2a0,
                            (Vector<float,_2> *)
                            ((long)((this->m_samplePositions).
                                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18));
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_2a0);
            std::ios_base::~ios_base(local_230);
            pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
            _local_2a8 = (pointer)&local_298;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2a8,"invalid sample position","");
            tcu::TestError::TestError(pTVar14,(string *)local_2a8);
            __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          iVar7 = iVar7 + 1;
          lVar18 = lVar18 + 8;
        } while ((long)this->m_samples * 8 != lVar18);
      }
      pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_100._0_8_ = (pointer)0x17;
      _local_2a8 = (pointer)&local_298;
      pcVar15 = (char *)std::__cxx11::string::_M_create((ulong *)local_2a8,(ulong)local_100);
      local_2a8 = SUB84(pcVar15,0);
      fStack_2a4 = (float)((ulong)pcVar15 >> 0x20);
      local_298._M_allocated_capacity._0_4_ = (undefined4)local_100._0_8_;
      local_298._M_allocated_capacity._4_4_ = SUB84(local_100._0_8_,4);
      builtin_strncpy(pcVar15,"Generate sampler shader",0x17);
      pcVar15[local_100._0_8_] = '\0';
      local_348._0_4_ = 3.22299e-44;
      local_348._4_4_ = 0.0;
      fStack_2a0 = (float)local_298._M_allocated_capacity._0_4_;
      fStack_29c = (float)local_298._M_allocated_capacity._4_4_;
      local_100._0_8_ = local_f0;
      local_100._0_8_ = std::__cxx11::string::_M_create((ulong *)local_100,(ulong)local_348);
      description = (string *)local_100;
      local_f0._0_8_ = local_348;
      *(undefined8 *)local_100._0_8_ = 0x65746172656e6547;
      *(undefined8 *)(local_100._0_8_ + 8) = 0x72656c706d617320;
      builtin_strncpy((char *)(local_100._0_8_ + 0xf),"r shader",8);
      local_100._8_8_ = local_348;
      *(char *)(local_100._0_8_ + (long)local_348) = '\0';
      tcu::ScopedLogSection::ScopedLogSection
                ((ScopedLogSection *)&local_2c8,pTVar1,(string *)local_2a8,description);
      if ((undefined1 *)local_100._0_8_ != local_f0) {
        operator_delete((void *)local_100._0_8_,local_f0._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(fStack_2a4,local_2a8) != &local_298) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(fStack_2a4,local_2a8),
                        CONCAT44(local_298._M_allocated_capacity._4_4_,
                                 local_298._M_allocated_capacity._0_4_) + 1);
      }
      iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      lVar18 = CONCAT44(extraout_var_01,iVar7);
      this_02 = (ShaderProgram *)operator_new(0xd0);
      pCVar4 = (this->super_TestCase).m_context;
      renderCtx = pCVar4->m_renderCtx;
      memset(local_2a8,0,0xac);
      local_1f8._0_8_ = (pointer)0x0;
      local_1f8[8] = 0;
      local_1f8._9_7_ = 0;
      local_1f8[0x10] = 0;
      local_1f8._17_8_ = 0;
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                ((string *)local_300,(_anonymous_namespace_ *)pCVar4->m_renderCtx,
                 (Context *)
                 "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
                 ,(char *)description);
      local_100._0_8_ = local_100._0_8_ & 0xffffffff00000000;
      local_100._8_8_ = local_f0 + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_100 + 8),CONCAT44(local_300._4_4_,local_300._0_4_),
                 (char *)(local_300._8_8_ + CONCAT44(local_300._4_4_,local_300._0_4_)));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2a8 + (local_100._0_8_ & 0xffffffff) * 0x18),
                  (value_type *)(local_100 + 8));
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_320,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx
                 ,(Context *)
                  "${GLSL_VERSION_DECL}\nlayout(location = 0) out highp vec4 fragColor;\nuniform highp sampler2DMS u_sampler;\nuniform highp int u_sample;\nvoid main (void)\n{\n\tfragColor = texelFetch(u_sampler, ivec2(int(floor(gl_FragCoord.x)), int(floor(gl_FragCoord.y))), u_sample);\n}\n"
                 ,(char *)description);
      local_348._0_4_ = 1.4013e-45;
      auStack_340 = (undefined1  [8])(local_338 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)auStack_340,local_320._M_dataplus._M_p,
                 local_320._M_dataplus._M_p + local_320._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2a8 + ((ulong)local_348 & 0xffffffff) * 0x18),(value_type *)auStack_340)
      ;
      glu::ShaderProgram::ShaderProgram(this_02,renderCtx,(ProgramSources *)local_2a8);
      this->m_samplerProgram = this_02;
      if (auStack_340 != (undefined1  [8])(local_338 + 8)) {
        operator_delete((void *)auStack_340,local_338._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_100._8_8_ != local_f0 + 8) {
        operator_delete((void *)local_100._8_8_,local_f0._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_300._4_4_,local_300._0_4_) != &local_2f0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_300._4_4_,local_300._0_4_),
                        local_2f0._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1f8);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_218);
      lVar17 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2a8 + lVar17));
        lVar17 = lVar17 + -0x18;
      } while (lVar17 != -0x18);
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                      this->m_samplerProgram);
      if ((this->m_samplerProgram->m_program).m_info.linkOk != false) {
        GVar10 = (**(code **)(lVar18 + 0x780))
                           ((this->m_samplerProgram->m_program).m_program,"a_position");
        this->m_samplerProgramPosLoc = GVar10;
        GVar10 = (**(code **)(lVar18 + 0xb48))
                           ((this->m_samplerProgram->m_program).m_program,"u_sampler");
        this->m_samplerProgramSamplerLoc = GVar10;
        GVar10 = (**(code **)(lVar18 + 0xb48))
                           ((this->m_samplerProgram->m_program).m_program,"u_sample");
        this->m_samplerProgramSampleNdxLoc = GVar10;
        tcu::TestLog::endSection((TestLog *)local_2c8._M_dataplus._M_p);
        return extraout_EAX;
      }
      pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
      _local_2a8 = (pointer)&local_298;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2a8,"Could not create sampler program.","");
      tcu::TestError::TestError(pTVar14,(string *)local_2a8);
      __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  de::toString<int>((string *)local_300,local_2d8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 "render target size must be at least ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300);
  plVar12 = (long *)std::__cxx11::string::append(local_348);
  local_100._0_8_ = *plVar12;
  ppSVar16 = (pointer)(plVar12 + 2);
  if ((pointer)local_100._0_8_ == ppSVar16) {
    local_f0._0_8_ = *ppSVar16;
    local_f0._8_8_ = plVar12[3];
    local_100._0_8_ = local_f0;
  }
  else {
    local_f0._0_8_ = *ppSVar16;
  }
  local_100._8_8_ = plVar12[1];
  *plVar12 = (long)ppSVar16;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  de::toString<int>(&local_320,local_2d8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                 &local_320);
  tcu::NotSupportedError::NotSupportedError(pNVar13,(string *)local_2a8);
  __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SamplePosRasterizationTest::init (void)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	GLint					maxSamples	= 0;

	// requirements

	if (m_context.getRenderTarget().getWidth() < m_canvasSize || m_context.getRenderTarget().getHeight() < m_canvasSize)
		throw tcu::NotSupportedError("render target size must be at least " + de::toString(m_canvasSize) + "x" + de::toString(m_canvasSize));

	gl.getIntegerv(GL_MAX_COLOR_TEXTURE_SAMPLES, &maxSamples);
	if (m_samples > maxSamples)
		throw tcu::NotSupportedError("Requested sample count is greater than GL_MAX_COLOR_TEXTURE_SAMPLES");

	m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_COLOR_TEXTURE_SAMPLES = " << maxSamples << tcu::TestLog::EndMessage;

	gl.getIntegerv(GL_SUBPIXEL_BITS, &m_subpixelBits);
	m_testCtx.getLog() << tcu::TestLog::Message << "GL_SUBPIXEL_BITS = " << m_subpixelBits << tcu::TestLog::EndMessage;

	// generate textures & other gl stuff

	m_testCtx.getLog() << tcu::TestLog::Message << "Creating multisample texture" << tcu::TestLog::EndMessage;

	gl.genTextures				(1, &m_texID);
	gl.bindTexture				(GL_TEXTURE_2D_MULTISAMPLE, m_texID);
	gl.texStorage2DMultisample	(GL_TEXTURE_2D_MULTISAMPLE, m_samples, GL_RGBA8, m_canvasSize, m_canvasSize, GL_TRUE);
	GLU_EXPECT_NO_ERROR			(gl.getError(), "texStorage2DMultisample");

	gl.genVertexArrays		(1, &m_vaoID);
	gl.bindVertexArray		(m_vaoID);
	GLU_EXPECT_NO_ERROR		(gl.getError(), "bindVertexArray");

	gl.genBuffers			(1, &m_vboID);
	gl.bindBuffer			(GL_ARRAY_BUFFER, m_vboID);
	GLU_EXPECT_NO_ERROR		(gl.getError(), "bindBuffer");

	// generate test scene
	for (int i = 0; i < 20; ++i)
	{
		// vertical spikes
		Triangle tri;
		tri.p1 = tcu::Vec4(((float)i        + 1.0f / (float)(i + 1)) / 20.0f,	 0.0f,	0.0f,	1.0f);
		tri.p2 = tcu::Vec4(((float)i + 0.3f + 1.0f / (float)(i + 1)) / 20.0f,	 0.0f,	0.0f,	1.0f);
		tri.p3 = tcu::Vec4(((float)i        + 1.0f / (float)(i + 1)) / 20.0f,	-1.0f,	0.0f,	1.0f);
		m_testTriangles.push_back(tri);
	}
	for (int i = 0; i < 20; ++i)
	{
		// horisontal spikes
		Triangle tri;
		tri.p1 = tcu::Vec4(-1.0f,	((float)i        + 1.0f / (float)(i + 1)) / 20.0f,	0.0f,	1.0f);
		tri.p2 = tcu::Vec4(-1.0f,	((float)i + 0.3f + 1.0f / (float)(i + 1)) / 20.0f,	0.0f,	1.0f);
		tri.p3 = tcu::Vec4( 0.0f,	((float)i        + 1.0f / (float)(i + 1)) / 20.0f,	0.0f,	1.0f);
		m_testTriangles.push_back(tri);
	}

	for (int i = 0; i < 20; ++i)
	{
		// fan
		const tcu::Vec2 p = tcu::Vec2(deFloatCos(((float)i)/20.0f*DE_PI*2) * 0.5f + 0.5f, deFloatSin(((float)i)/20.0f*DE_PI*2) * 0.5f + 0.5f);
		const tcu::Vec2 d = tcu::Vec2(0.1f, 0.02f);

		Triangle tri;
		tri.p1 = tcu::Vec4(0.4f,			0.4f,			0.0f,	1.0f);
		tri.p2 = tcu::Vec4(p.x(),			p.y(),			0.0f,	1.0f);
		tri.p3 = tcu::Vec4(p.x() + d.x(),	p.y() + d.y(),	0.0f,	1.0f);
		m_testTriangles.push_back(tri);
	}
	{
		Triangle tri;
		tri.p1 = tcu::Vec4(-0.202f, -0.202f, 0.0f, 1.0f);
		tri.p2 = tcu::Vec4(-0.802f, -0.202f, 0.0f, 1.0f);
		tri.p3 = tcu::Vec4(-0.802f, -0.802f, 0.0f, 1.0f);
		m_testTriangles.push_back(tri);
	}

	// generate multisample texture (and query the sample positions in it)
	genMultisampleTexture();

	// verify queried samples are in a valid range
	for (int sampleNdx = 0; sampleNdx < m_samples; ++sampleNdx)
	{
		if (m_samplePositions[sampleNdx].x() < 0.0f || m_samplePositions[sampleNdx].x() > 1.0f ||
			m_samplePositions[sampleNdx].y() < 0.0f || m_samplePositions[sampleNdx].y() > 1.0f)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "// ERROR: Sample position of sample " << sampleNdx << " should be in range ([0, 1], [0, 1]). Got " << m_samplePositions[sampleNdx] << tcu::TestLog::EndMessage;
			throw tcu::TestError("invalid sample position");
		}
	}

	// generate sampler program
	genSamplerProgram();
}